

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall
Fl_Text_Display::skip_lines(Fl_Text_Display *this,int startPos,int nLines,bool startPosIsLineStart)

{
  int startPos_00;
  int maxPos;
  Fl_Text_Buffer *pFVar1;
  Fl_Text_Buffer *this_00;
  int local_3c;
  int local_38;
  int retLineEnd;
  int retLineStart;
  int retPos;
  int retLines;
  int iStack_24;
  bool startPosIsLineStart_local;
  int nLines_local;
  int startPos_local;
  Fl_Text_Display *this_local;
  
  retPos._3_1_ = startPosIsLineStart;
  retLines = nLines;
  iStack_24 = startPos;
  _nLines_local = this;
  if (this->mContinuousWrap == 0) {
    pFVar1 = buffer(this);
    this_local._4_4_ = Fl_Text_Buffer::skip_lines(pFVar1,iStack_24,retLines);
  }
  else {
    this_local._4_4_ = startPos;
    if (nLines != 0) {
      pFVar1 = buffer(this);
      startPos_00 = iStack_24;
      this_00 = buffer(this);
      maxPos = Fl_Text_Buffer::length(this_00);
      wrapped_line_counter
                (this,pFVar1,startPos_00,maxPos,retLines,(bool)(retPos._3_1_ & 1),0,&retLineEnd,
                 &retLineStart,&local_38,&local_3c,true);
      this_local._4_4_ = retLineEnd;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::skip_lines(int startPos, int nLines,
                                bool startPosIsLineStart) {
  IS_UTF8_ALIGNED2(buffer(), startPos)

  int retLines, retPos, retLineStart, retLineEnd;

  /* if we're not wrapping use more efficient BufCountForwardNLines */
  if (!mContinuousWrap)
    return buffer()->skip_lines(startPos, nLines);

  /* wrappedLineCounter can't handle the 0 lines case */
  if (nLines == 0)
    return startPos;

  /* use the common line counting routine to count forward */
  wrapped_line_counter(buffer(), startPos, buffer()->length(),
                       nLines, startPosIsLineStart, 0,
                       &retPos, &retLines, &retLineStart, &retLineEnd);
  IS_UTF8_ALIGNED2(buffer(), retPos)
  return retPos;
}